

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

void deltest(void *elem)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  while ((lVar2 < arraylen && (iVar1 = (*cmp)(elem,array[lVar2]), 0 < iVar1))) {
    lVar2 = lVar2 + 1;
  }
  if (((int)lVar2 < arraylen) && (iVar1 = (*cmp)(elem,array[lVar2]), iVar1 == 0)) {
    delpostest((int)lVar2);
    return;
  }
  return;
}

Assistant:

void deltest(void *elem)
{
    int i;

    i = 0;
    while (i < arraylen && cmp(elem, array[i]) > 0)
        i++;
    if (i >= arraylen || cmp(elem, array[i]) != 0)
        return;                        /* don't do it! */
    delpostest(i);
}